

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O0

void aom_avg_8x8_quad_sse2(uint8_t *s,int p,int x16_idx,int y16_idx,int *avg)

{
  uint8_t *s_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int k;
  uint8_t *s_ptr;
  int *in_stack_ffffffffffffffc8;
  int p_00;
  
  s_00 = (uint8_t *)(in_RDI + in_ECX * in_ESI + (long)in_EDX);
  for (p_00 = 0; p_00 < 2; p_00 = p_00 + 1) {
    calc_avg_8x8_dual_sse2(s_00,p_00,in_stack_ffffffffffffffc8);
    s_00 = s_00 + (in_ESI << 3);
  }
  return;
}

Assistant:

void aom_avg_8x8_quad_sse2(const uint8_t *s, int p, int x16_idx, int y16_idx,
                           int *avg) {
  const uint8_t *s_ptr = s + y16_idx * p + x16_idx;
  for (int k = 0; k < 2; k++) {
    calc_avg_8x8_dual_sse2(s_ptr, p, avg + k * 2);
    s_ptr += 8 * p;
  }
}